

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

void __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::SignalLink::
decref(SignalLink *this)

{
  void *in_RDI;
  
  *(int *)((long)in_RDI + 0x30) = *(int *)((long)in_RDI + 0x30) + -1;
  if ((*(int *)((long)in_RDI + 0x30) == 0) && (in_RDI != (void *)0x0)) {
    ~SignalLink((SignalLink *)0x2a2f47);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void decref() {
      ref_count -= 1;
      if (!ref_count)
        delete this;
      else
        assert(ref_count > 0);
    }